

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_xpcall(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  int errcode_00;
  int errcode;
  TRef tmp;
  TValue argv1;
  TValue argv0;
  RecordFFData *rd_local;
  jit_State *J_local;
  TValue local_120;
  TValue local_118;
  TValue *local_110;
  TValue local_108;
  TValue local_100;
  TValue *local_f8;
  TValue *local_f0;
  TValue local_e8;
  int *local_e0;
  TValue *local_d8;
  GCtrace *local_d0;
  TValue *local_c8;
  IRIns local_c0;
  IRIns local_b8;
  TValue *local_b0;
  IRIns local_a8;
  IRIns local_a0;
  char *local_98;
  IRIns local_90;
  IRIns local_88;
  char *local_80;
  IRIns local_78;
  IRIns local_70;
  char *local_68;
  TValue *local_60;
  GCtrace *local_58;
  char *local_50;
  TValue *local_48;
  TValue local_40;
  char *local_38;
  TValue local_30;
  TValue local_28;
  char *local_20;
  TValue local_18;
  TValue local_10;
  
  if (1 < J->maxslot) {
    TVar1 = *J->base;
    *J->base = J->base[1];
    J->base[1] = TVar1;
    local_a0 = (IRIns)J->L;
    local_b0 = rd->argv;
    local_a8 = (IRIns)&argv1;
    argv1 = *local_b0;
    local_98 = "copy of dead GC object";
    local_b8 = (IRIns)J->L;
    local_c8 = rd->argv + 1;
    local_c0 = (IRIns)&errcode;
    _errcode = (TValue)(local_c8->gcr).gcptr64;
    local_80 = "copy of dead GC object";
    local_d0 = (GCtrace *)J->L;
    local_d8 = rd->argv;
    local_e0 = &errcode;
    *local_d8 = _errcode;
    local_68 = "copy of dead GC object";
    local_e8 = (TValue)J->L;
    local_f0 = rd->argv + 1;
    local_f8 = &argv1;
    *local_f0 = argv1;
    local_50 = "copy of dead GC object";
    argv0 = (TValue)rd;
    rd_local = (RecordFFData *)J;
    local_90 = local_a8;
    local_88 = local_a0;
    local_78 = local_c0;
    local_70 = local_b8;
    local_60 = local_d8;
    local_58 = local_d0;
    local_48 = local_f0;
    local_40 = local_e8;
    memmove(J->base + 2,J->base + 1,(ulong)(J->maxslot - 1) << 2);
    errcode_00 = lj_vm_cpcall(rd_local[5].nres,0,rd_local,recff_xpcall_cp);
    local_100 = (TValue)rd_local[5].nres;
    local_108.u64 = *argv0.u64;
    local_110 = &argv1;
    *(TValue *)local_108 = argv1;
    local_38 = "copy of dead GC object";
    local_118 = (TValue)rd_local[5].nres;
    local_120.u64 = *(long *)argv0 + 8;
    J_local = (jit_State *)&errcode;
    *(TValue *)local_120 = _errcode;
    local_20 = "copy of dead GC object";
    if (errcode_00 != 0) {
      local_30 = local_108;
      local_28 = local_100;
      local_18.u64 = local_120.u64;
      local_10 = local_118;
      lj_err_throw((lua_State *)rd_local[5].nres,errcode_00);
    }
    *(undefined8 *)(argv0.u64 + 8) = 0xffffffffffffffff;
    *(undefined1 *)((long)&rd_local[7].nres + 5) = 1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_xpcall(jit_State *J, RecordFFData *rd)
{
  if (J->maxslot >= 2) {
    TValue argv0, argv1;
    TRef tmp;
    int errcode;
    /* Swap function and traceback. */
    tmp = J->base[0]; J->base[0] = J->base[1]; J->base[1] = tmp;
    copyTV(J->L, &argv0, &rd->argv[0]);
    copyTV(J->L, &argv1, &rd->argv[1]);
    copyTV(J->L, &rd->argv[0], &argv1);
    copyTV(J->L, &rd->argv[1], &argv0);
#if LJ_FR2
    /* Shift function arguments up. */
    memmove(J->base + 2, J->base + 1, sizeof(TRef) * (J->maxslot-1));
#endif
    /* Need to protect lj_record_call because it may throw. */
    errcode = lj_vm_cpcall(J->L, NULL, J, recff_xpcall_cp);
    /* Always undo Lua stack swap to avoid confusing the interpreter. */
    copyTV(J->L, &rd->argv[0], &argv0);
    copyTV(J->L, &rd->argv[1], &argv1);
    if (errcode)
      lj_err_throw(J->L, errcode);  /* Propagate errors. */
    rd->nres = -1;  /* Pending call. */
    J->needsnap = 1;  /* Start catching on-trace errors. */
  }  /* else: Interpreter will throw. */
}